

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseDataModuleField(WastParser *this,Module *module)

{
  ExprList *out_expr_list;
  string_view name_00;
  bool bVar1;
  Result RVar2;
  _Head_base<0UL,_wabt::DataSegmentModuleField_*,_false> _Var3;
  Enum EVar4;
  Location loc;
  string name;
  _Head_base<0UL,_wabt::DataSegmentModuleField_*,_false> local_e0;
  Location local_d8;
  Token local_b8;
  Var local_78;
  
  RVar2 = Expect(this,Lpar);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  GetToken(&local_b8,this);
  local_d8.field_1.field_1.offset._1_7_ = local_b8.loc.field_1.field_1.offset._1_7_;
  local_d8.field_1.field2[0] = local_b8.loc.field_1.field2[0];
  local_d8.field_1._8_8_ = local_b8.loc.field_1._8_8_;
  local_d8.filename.data_ = local_b8.loc.filename.data_;
  local_d8.filename.size_ = local_b8.loc.filename.size_;
  RVar2 = Expect(this,Data);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  local_b8.loc.filename.data_ = (char *)&local_b8.loc.field_1;
  local_b8.loc.filename.size_ = 0;
  local_b8.loc.field_1.field2[0] = 0;
  ParseBindVarOpt(this,(string *)&local_b8);
  _Var3._M_head_impl = (DataSegmentModuleField *)operator_new(0xe0);
  name_00.size_ = local_b8.loc.filename.size_;
  name_00.data_ = local_b8.loc.filename.data_;
  ((_Var3._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
  ((_Var3._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
  ((_Var3._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.
  _vptr_ModuleField = (_func_int **)&PTR__ModuleField_001c3370;
  ((_Var3._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.loc.
  field_1.field_1.offset = (size_t)local_d8.field_1.field_1.offset;
  *(undefined8 *)
   ((long)&((_Var3._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).
           super_ModuleField.loc.field_1 + 8) = local_d8.field_1._8_8_;
  ((_Var3._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.loc.
  filename.data_ = local_d8.filename.data_;
  ((_Var3._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.loc.
  filename.size_ = local_d8.filename.size_;
  ((_Var3._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.type_ =
       DataSegment;
  ((_Var3._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.
  _vptr_ModuleField = (_func_int **)&PTR__DataSegmentModuleField_001c39a8;
  DataSegment::DataSegment(&(_Var3._M_head_impl)->data_segment,name_00);
  bVar1 = PeekMatchLpar(this,Memory);
  if (bVar1) {
    RVar2 = Expect(this,Lpar);
    EVar4 = Error;
    if ((((RVar2.enum_ == Error) || (RVar2 = Expect(this,Memory), RVar2.enum_ == Error)) ||
        (RVar2 = ParseVar(this,&((_Var3._M_head_impl)->data_segment).memory_var),
        RVar2.enum_ == Error)) || (RVar2 = Expect(this,Rpar), RVar2.enum_ == Error))
    goto LAB_0016b006;
    RVar2 = ParseOffsetExpr(this,&((_Var3._M_head_impl)->data_segment).offset);
joined_r0x0016af5a:
    EVar4 = Error;
    if (RVar2.enum_ == Error) goto LAB_0016b006;
  }
  else {
    Var::Var(&local_78,0,&local_d8);
    bVar1 = ParseVarOpt(this,&((_Var3._M_head_impl)->data_segment).memory_var,&local_78);
    Var::~Var(&local_78);
    out_expr_list = &((_Var3._M_head_impl)->data_segment).offset;
    if (bVar1) {
      RVar2 = ParseOffsetExpr(this,out_expr_list);
      goto joined_r0x0016af5a;
    }
    bVar1 = ParseOffsetExprOpt(this,out_expr_list);
    if (!bVar1) {
      if ((this->options_->features).bulk_memory_enabled_ == false) {
        Error(this,0x19f2a7);
        EVar4 = Error;
        goto LAB_0016b006;
      }
      ((_Var3._M_head_impl)->data_segment).kind = Passive;
    }
  }
  ParseTextListOpt(this,&((_Var3._M_head_impl)->data_segment).data);
  RVar2 = Expect(this,Rpar);
  EVar4 = Error;
  if (RVar2.enum_ != Error) {
    local_e0._M_head_impl = _Var3._M_head_impl;
    Module::AppendField(module,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                *)&local_e0);
    if ((_Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
         )local_e0._M_head_impl != (DataSegmentModuleField *)0x0) {
      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
    }
    local_e0._M_head_impl = (DataSegmentModuleField *)0x0;
    EVar4 = Ok;
    _Var3._M_head_impl = (DataSegmentModuleField *)0x0;
  }
LAB_0016b006:
  if (_Var3._M_head_impl != (DataSegmentModuleField *)0x0) {
    (**(code **)(*(long *)_Var3._M_head_impl + 8))(_Var3._M_head_impl);
  }
  if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_b8.loc.filename.data_ !=
      &local_b8.loc.field_1) {
    operator_delete(local_b8.loc.filename.data_);
  }
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseDataModuleField(Module* module) {
  WABT_TRACE(ParseDataModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Data);
  std::string name;
  ParseBindVarOpt(&name);
  auto field = MakeUnique<DataSegmentModuleField>(loc, name);

  if (PeekMatchLpar(TokenType::Memory)) {
    EXPECT(Lpar);
    EXPECT(Memory);
    CHECK_RESULT(ParseVar(&field->data_segment.memory_var));
    EXPECT(Rpar);
    CHECK_RESULT(ParseOffsetExpr(&field->data_segment.offset));
  } else if (ParseVarOpt(&field->data_segment.memory_var, Var(0, loc))) {
    CHECK_RESULT(ParseOffsetExpr(&field->data_segment.offset));
  } else if (!ParseOffsetExprOpt(&field->data_segment.offset)) {
    if (!options_->features.bulk_memory_enabled()) {
      Error(loc, "passive data segments are not allowed");
      return Result::Error;
    }

    field->data_segment.kind = SegmentKind::Passive;
  }

  ParseTextListOpt(&field->data_segment.data);
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}